

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_opt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ResourceTag RVar1;
  size_t sVar2;
  pointer __n;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  DatabaseInterface *pDVar7;
  pointer pDVar8;
  reference puVar9;
  uchar *buffer;
  size_type size;
  size_type local_348;
  size_t state_json_size;
  unsigned_long hash;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_318 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t hash_count;
  ResourceTag *tag;
  ResourceTag *__end1;
  ResourceTag *__begin1;
  ResourceTag (*__range1) [7];
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  StateReplayer replayer;
  OptimizeReplayer optimize_replayer;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  output_db;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  input_db;
  CLICallbacks local_288;
  undefined1 local_210 [8];
  CLIParser parser;
  anon_class_8_1_0748e643 local_178;
  function<void_(Fossilize::CLIParser_&)> local_170;
  anon_class_8_1_7841c046 local_150;
  function<void_(Fossilize::CLIParser_&)> local_148;
  anon_class_8_1_eedc21f1 local_128;
  function<void_(Fossilize::CLIParser_&)> local_120;
  anon_class_1_0_00000001 local_f9;
  function<void_(Fossilize::CLIParser_&)> local_f8;
  bool local_d1;
  undefined1 local_d0 [7];
  bool optimize_size;
  CLICallbacks cbs;
  string output_db_path;
  string input_db_path;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::__cxx11::string::string((string *)(output_db_path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&cbs.default_handler._M_invoker);
  Fossilize::CLICallbacks::CLICallbacks((CLICallbacks *)local_d0);
  local_d1 = false;
  std::function<void(Fossilize::CLIParser&)>::function<main::__0,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_f8,&local_f9);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_d0,"--help",&local_f8);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_f8);
  local_128.input_db_path = (string *)((long)&output_db_path.field_2 + 8);
  std::function<void(Fossilize::CLIParser&)>::function<main::__1,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_120,&local_128);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_d0,"--input-db",&local_120);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_120);
  local_150.output_db_path = (string *)&cbs.default_handler._M_invoker;
  std::function<void(Fossilize::CLIParser&)>::function<main::__2,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_148,&local_150);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_d0,"--output-db",&local_148);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_148);
  local_178.optimize_size = &local_d1;
  std::function<void(Fossilize::CLIParser&)>::function<main::__3,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_170,&local_178);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_d0,"--optimize-size",&local_170);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_170);
  std::function<void()>::operator=
            ((function<void()> *)&cbs.callbacks._M_h._M_single_bucket,
             (anon_class_1_0_00000001 *)&parser.field_0x8f);
  Fossilize::CLICallbacks::CLICallbacks(&local_288,(CLICallbacks *)local_d0);
  Fossilize::CLIParser::CLIParser((CLIParser *)local_210,&local_288,argc + -1,argv + 1);
  Fossilize::CLICallbacks::~CLICallbacks(&local_288);
  bVar3 = Fossilize::CLIParser::parse((CLIParser *)local_210);
  if (!bVar3) {
    argv_local._4_4_ = 1;
    goto LAB_0013f61f;
  }
  bVar3 = Fossilize::CLIParser::is_ended_state((CLIParser *)local_210);
  if (bVar3) {
    argv_local._4_4_ = 0;
    goto LAB_0013f61f;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Fossilize ERROR: No input database provided.\n");
    fflush(_stderr);
    print_help();
    argv_local._4_4_ = 1;
    goto LAB_0013f61f;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Fossilize ERROR: No output database provided.\n");
    fflush(_stderr);
    print_help();
    argv_local._4_4_ = 1;
    goto LAB_0013f61f;
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  pDVar7 = Fossilize::create_database(pcVar6,ReadOnly);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&output_db,pDVar7);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  pDVar7 = Fossilize::create_database(pcVar6,OverWrite);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&optimize_replayer.optimize_size,pDVar7);
  OptimizeReplayer::OptimizeReplayer((OptimizeReplayer *)&replayer);
  optimize_replayer.recorder.impl._0_1_ = local_d1 & 1;
  Fossilize::StateReplayer::StateReplayer
            ((StateReplayer *)
             &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Fossilize::StateRecorder::set_database_enable_checksum((StateRecorder *)&optimize_replayer,true);
  Fossilize::StateRecorder::set_database_enable_compression
            ((StateRecorder *)&optimize_replayer,true);
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&output_db);
  if (bVar3) {
    pDVar8 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&output_db);
    uVar4 = (*pDVar8->_vptr_DatabaseInterface[2])();
    if ((uVar4 & 1) == 0) goto LAB_0013f0ea;
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&optimize_replayer.optimize_size);
    if (bVar3) {
      pDVar8 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::get((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                      *)&optimize_replayer.optimize_size);
      Fossilize::StateRecorder::init_recording_thread((StateRecorder *)&optimize_replayer,pDVar8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
      for (__end1 = main::playback_order; __end1 != (ResourceTag *)&std::piecewise_construct;
          __end1 = __end1 + 1) {
        hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&output_db);
        uVar4 = (*pDVar8->_vptr_DatabaseInterface[6])
                          (pDVar8,(ulong)*__end1,
                           &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        __n = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        if ((uVar4 & 1) == 0) {
          fprintf(_stderr,"Fossilize ERROR: Failed to get hashes.\n");
          fflush(_stderr);
          argv_local._4_4_ = 1;
          break;
        }
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&__range2 + 7));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_318,(size_type)__n
                   ,(allocator_type *)((long)&__range2 + 7));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&__range2 + 7))
        ;
        pDVar8 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&output_db);
        RVar1 = *__end1;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_318);
        uVar4 = (*pDVar8->_vptr_DatabaseInterface[6])
                          (pDVar8,(ulong)RVar1,
                           &hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((uVar4 & 1) == 0) {
          fprintf(_stderr,"Fossilize ERROR: Failed to get shader module hashes.\n");
          fflush(_stderr);
          argv_local._4_4_ = 1;
          bVar3 = true;
        }
        else {
          __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_318);
          hash = (unsigned_long)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_318);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                             *)&hash), bVar3) {
            puVar9 = __gnu_cxx::
                     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::operator*(&__end2);
            state_json_size = *puVar9;
            pDVar8 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::operator->(&output_db);
            uVar4 = (*pDVar8->_vptr_DatabaseInterface[3])
                              (pDVar8,(ulong)*__end1,state_json_size,&local_348,0,0);
            if ((uVar4 & 1) == 0) {
              fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
              fflush(_stderr);
              argv_local._4_4_ = 1;
              bVar3 = true;
              goto LAB_0013f5a8;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,local_348)
            ;
            pDVar8 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::operator->(&output_db);
            sVar2 = state_json_size;
            RVar1 = *__end1;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
            uVar4 = (*pDVar8->_vptr_DatabaseInterface[3])(pDVar8,(ulong)RVar1,sVar2);
            if ((uVar4 & 1) == 0) {
              fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
              fflush(_stderr);
              argv_local._4_4_ = 1;
              bVar3 = true;
              goto LAB_0013f5a8;
            }
            pDVar8 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::get(&output_db);
            buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
            size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
            bVar3 = Fossilize::StateReplayer::parse
                              ((StateReplayer *)
                               &state_json.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (StateCreatorInterface *)&replayer,pDVar8,buffer,size);
            if (!bVar3) {
              fprintf(_stderr,"Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%lx).\n",
                      (ulong)*__end1);
              fflush(_stderr);
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end2);
          }
          bVar3 = false;
        }
LAB_0013f5a8:
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_318);
        if (bVar3) break;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
    }
    else {
      fprintf(_stderr,"Fossilize ERROR: Failed to open database for writing: %s\n",argv[2]);
      fflush(_stderr);
      argv_local._4_4_ = 1;
    }
  }
  else {
LAB_0013f0ea:
    fprintf(_stderr,"Fossilize ERROR: Failed to load database: %s\n",argv[1]);
    fflush(_stderr);
    argv_local._4_4_ = 1;
  }
  Fossilize::StateReplayer::~StateReplayer
            ((StateReplayer *)
             &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  OptimizeReplayer::~OptimizeReplayer((OptimizeReplayer *)&replayer);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 *)&optimize_replayer.optimize_size);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&output_db);
LAB_0013f61f:
  Fossilize::CLIParser::~CLIParser((CLIParser *)local_210);
  Fossilize::CLICallbacks::~CLICallbacks((CLICallbacks *)local_d0);
  std::__cxx11::string::~string((string *)&cbs.default_handler._M_invoker);
  std::__cxx11::string::~string((string *)(output_db_path.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	string input_db_path;
	string output_db_path;
	CLICallbacks cbs;
	bool optimize_size = false;

	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--input-db", [&](CLIParser &parser) { input_db_path = parser.next_string(); });
	cbs.add("--output-db", [&](CLIParser &parser) { output_db_path = parser.next_string(); });
	cbs.add("--optimize-size", [&](CLIParser &) { optimize_size = true; });
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (input_db_path.empty())
	{
		LOGE("No input database provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	if (output_db_path.empty())
	{
		LOGE("No output database provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(input_db_path.c_str(), DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(output_db_path.c_str(), DatabaseMode::OverWrite));

	OptimizeReplayer optimize_replayer;
	optimize_replayer.optimize_size = optimize_size;

	StateReplayer replayer;
	optimize_replayer.recorder.set_database_enable_checksum(true);
	optimize_replayer.recorder.set_database_enable_compression(true);

	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db)
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	// Recording thread prepares.
	optimize_replayer.recorder.init_recording_thread(output_db.get());

	static const ResourceTag playback_order[] = {
		RESOURCE_SHADER_MODULE,
		RESOURCE_SAMPLER,
		RESOURCE_DESCRIPTOR_SET_LAYOUT,
		RESOURCE_PIPELINE_LAYOUT,
		RESOURCE_RENDER_PASS,
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
	};

	vector<uint8_t> state_json;
	for (auto &tag : playback_order)
	{
		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		vector<Hash> hashes(hash_count);

		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		for (auto hash : hashes)
		{
			size_t state_json_size;
			if (!input_db->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);

			if (!input_db->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			if (!replayer.parse(optimize_replayer, input_db.get(), state_json.data(), state_json.size()))
				LOGE("Failed to parse blob (tag: %d, hash: 0x%" PRIx64 ").\n", tag, hash);
		}
	}
}